

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O1

void helper_mttlo_mips64el(CPUMIPSState_conflict5 *env,target_ulong arg1,uint32_t sel)

{
  CPUMIPSState_conflict5 *pCVar1;
  uint32_t uVar2;
  
  if ((env->CP0_VPEConf0 & 2) == 0) {
    uVar2 = env->current_tc;
  }
  else {
    uVar2 = (uint32_t)
            ((long)(ulong)(byte)env->CP0_VPEControl %
            (long)*(int *)((long)env[-3].tcs[0xc].gpr + 0x94));
  }
  pCVar1 = (CPUMIPSState_conflict5 *)(env->tcs + (int)uVar2);
  if (uVar2 == env->current_tc) {
    pCVar1 = env;
  }
  (pCVar1->active_tc).LO[sel] = arg1;
  return;
}

Assistant:

void helper_mttlo(CPUMIPSState *env, target_ulong arg1, uint32_t sel)
{
    int other_tc = env->CP0_VPEControl & (0xff << CP0VPECo_TargTC);
    CPUMIPSState *other = mips_cpu_map_tc(env, &other_tc);

    if (other_tc == other->current_tc) {
        other->active_tc.LO[sel] = arg1;
    } else {
        other->tcs[other_tc].LO[sel] = arg1;
    }
}